

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O0

c_v128 c_v128_padd_s16(c_v128 a)

{
  c_v128 cVar1;
  c_v128 a_local;
  c_v128 t;
  
  a_local.u16[0] = a.u16[0];
  a_local.u16[1] = a.u16[1];
  a_local.u16[2] = a.u16[2];
  a_local.u16[3] = a.u16[3];
  a_local.u16[4] = a.u16[4];
  a_local.u16[5] = a.u16[5];
  a_local.u16[6] = a.u16[6];
  a_local.u16[7] = a.u16[7];
  cVar1.u32[1] = (int)a_local.s16[2] + (int)a_local.s16[3];
  cVar1.u32[0] = (int)a_local.s16[0] + (int)a_local.s16[1];
  cVar1.u32[2] = (int)a_local.s16[4] + (int)a_local.s16[5];
  cVar1.u32[3] = (int)a_local.s16[6] + (int)a_local.s16[7];
  return cVar1;
}

Assistant:

SIMD_INLINE c_v128 c_v128_padd_s16(c_v128 a) {
  c_v128 t;
  t.s32[0] = (int32_t)a.s16[0] + (int32_t)a.s16[1];
  t.s32[1] = (int32_t)a.s16[2] + (int32_t)a.s16[3];
  t.s32[2] = (int32_t)a.s16[4] + (int32_t)a.s16[5];
  t.s32[3] = (int32_t)a.s16[6] + (int32_t)a.s16[7];
  return t;
}